

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinFunction::
     Combine<duckdb::HistogramBinState<float>,duckdb::HistogramBinFunction>
               (HistogramBinState<float> *source,HistogramBinState<float> *target,
               AggregateInputData *input_data)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  vector<float,_std::allocator<float>_> *this;
  unsafe_vector<idx_t> *puVar5;
  NotImplementedException *this_00;
  InternalException *this_01;
  long lVar6;
  long lVar7;
  allocator local_49;
  string local_48;
  
  if (&source->bin_boundaries->super_vector<float,_std::allocator<float>_> !=
      (vector<float,_std::allocator<float>_> *)0x0) {
    if (&target->bin_boundaries->super_vector<float,_std::allocator<float>_> ==
        (vector<float,_std::allocator<float>_> *)0x0) {
      this = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
      (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      target->bin_boundaries = (unsafe_vector<float> *)this;
      puVar5 = (unsafe_vector<idx_t> *)operator_new(0x18);
      (puVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (puVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (puVar5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      target->counts = puVar5;
      ::std::vector<float,_std::allocator<float>_>::operator=
                (this,&source->bin_boundaries->super_vector<float,_std::allocator<float>_>);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)target->counts,
                 &source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    bVar4 = ::std::operator!=(&target->bin_boundaries->super_vector<float,_std::allocator<float>_>,
                              &source->bin_boundaries->super_vector<float,_std::allocator<float>_>);
    if (bVar4) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,
                 "Histogram - cannot combine histograms with different bin boundaries. Bin boundaries must be the same for all histograms within the same group"
                 ,&local_49);
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar2 = (target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(target->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2;
    puVar3 = (source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (lVar6 != (long)(source->counts->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
                       .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,
                 "Histogram combine - bin boundaries are the same but counts are different",
                 &local_49);
      InternalException::InternalException(this_01,&local_48);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    for (lVar7 = 0; lVar6 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      puVar1 = puVar2 + lVar7;
      *puVar1 = *puVar1 + puVar3[lVar7];
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.bin_boundaries) {
			// nothing to combine
			return;
		}
		if (!target.bin_boundaries) {
			// target does not have bin boundaries - copy everything over
			target.bin_boundaries = new unsafe_vector<typename STATE::TYPE>();
			target.counts = new unsafe_vector<idx_t>();
			*target.bin_boundaries = *source.bin_boundaries;
			*target.counts = *source.counts;
		} else {
			// both source and target have bin boundaries
			if (*target.bin_boundaries != *source.bin_boundaries) {
				throw NotImplementedException(
				    "Histogram - cannot combine histograms with different bin boundaries. "
				    "Bin boundaries must be the same for all histograms within the same group");
			}
			if (target.counts->size() != source.counts->size()) {
				throw InternalException("Histogram combine - bin boundaries are the same but counts are different");
			}
			D_ASSERT(target.counts->size() == source.counts->size());
			for (idx_t bin_idx = 0; bin_idx < target.counts->size(); bin_idx++) {
				(*target.counts)[bin_idx] += (*source.counts)[bin_idx];
			}
		}
	}